

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O1

void __thiscall xemmai::t_emit::f_resolve(t_emit *this)

{
  deque<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_> *pdVar1;
  _Elt_pointer ptVar2;
  pointer puVar3;
  size_t sVar4;
  pointer ppvVar5;
  t_label *label;
  _Elt_pointer ptVar6;
  _Map_pointer pptVar7;
  _Elt_pointer ptVar8;
  pointer puVar9;
  
  pdVar1 = this->v_labels;
  ptVar6 = (pdVar1->
           super__Deque_base<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_>).
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  ptVar2 = (pdVar1->
           super__Deque_base<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_>).
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ptVar6 != ptVar2) {
    ptVar8 = (pdVar1->
             super__Deque_base<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_>).
             _M_impl.super__Deque_impl_data._M_start._M_last;
    pptVar7 = (pdVar1->
              super__Deque_base<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_>).
              _M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      puVar9 = (ptVar6->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar3 = (ptVar6->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (puVar9 != puVar3) {
        sVar4 = ptVar6->v_target;
        ppvVar5 = (this->v_code->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          (this->v_code->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
          .super__Vector_impl_data._M_start[*puVar9] = ppvVar5 + sVar4;
          puVar9 = puVar9 + 1;
        } while (puVar9 != puVar3);
      }
      ptVar6 = ptVar6 + 1;
      if (ptVar6 == ptVar8) {
        ptVar6 = pptVar7[1];
        pptVar7 = pptVar7 + 1;
        ptVar8 = ptVar6 + 0x10;
      }
    } while (ptVar6 != ptVar2);
  }
  return;
}

Assistant:

void f_resolve()
	{
		for (const auto& label : *v_labels) {
			void* p = &v_code->v_instructions[label.v_target];
			for (auto i : label) v_code->v_instructions[i] = p;
		}
	}